

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::define(BoxArray *this,BoxList *bl)

{
  IndexType IVar1;
  BoxList *in_RSI;
  BoxList *in_RDI;
  BoxArray *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffa0;
  BATransformer *in_stack_ffffffffffffffa8;
  undefined4 uStack_50;
  IndexType in_stack_ffffffffffffffb4;
  pointer local_48;
  undefined8 uStack_40;
  BoxArray *in_stack_ffffffffffffffc8;
  pointer pBStack_30;
  pointer local_28;
  undefined8 uStack_20;
  pointer local_18;
  
  clear(unaff_retaddr);
  IVar1 = BoxList::ixType(in_RSI);
  BATransformer::BATransformer(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4);
  in_RDI[2].m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = local_18;
  in_RDI[1].m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_28;
  *(undefined8 *)&in_RDI[1].btype = uStack_20;
  in_RDI[1].m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffffc8;
  in_RDI[1].m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = pBStack_30;
  (in_RDI->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_48;
  *(undefined8 *)&in_RDI->btype = uStack_40;
  (in_RDI->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffffa8;
  (in_RDI->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(in_stack_ffffffffffffffb4.itype,uStack_50);
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0xfb44a5
            );
  BARef::define((BARef *)CONCAT44(IVar1.itype,in_stack_ffffffffffffffa0),in_RDI);
  type_update(in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
BoxArray::define (BoxList&& bl) noexcept
{
    clear();
    m_bat = BATransformer(bl.ixType());
    m_ref->define(std::move(bl));
    type_update();
}